

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

void Gia_ManBmcAddCnfNew(Bmc_Mna_t *p,int iStart,int iStop)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Man_t *pGVar2;
  ulong uVar3;
  
  if (iStart < iStop) {
    uVar3 = (ulong)(uint)iStart;
    do {
      pGVar2 = p->pFrames;
      iVar1 = pGVar2->vCos->nSize;
      if (iVar1 - pGVar2->nRegs <= (int)uVar3) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d0,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((iStart < 0) || (iVar1 <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pGVar2->vCos->pArray[uVar3];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pObj = pGVar2->pObjs + iVar1;
      if (pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff) != pGVar2->pObjs) {
        Gia_ManBmcAddCnfNew_rec(p,pObj);
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < iStop);
  }
  return;
}

Assistant:

void Gia_ManBmcAddCnfNew( Bmc_Mna_t * p, int iStart, int iStop )
{
    Gia_Obj_t * pObj;
    int i;
    for ( i = iStart; i < iStop; i++ )
    {
        pObj = Gia_ManPo(p->pFrames, i);
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(p->pFrames) )
            continue;
        Gia_ManBmcAddCnfNew_rec( p, pObj );
    }
}